

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O0

bool option::Parser::streqabbr(char *st1,char *st2,longlong min)

{
  bool bVar1;
  bool local_2b;
  bool local_2a;
  char *st1start;
  longlong min_local;
  char *st2_local;
  char *st1_local;
  
  min_local = (longlong)st2;
  st2_local = st1;
  while( true ) {
    bVar1 = false;
    if (*st2_local != '\0') {
      bVar1 = *st2_local == *(char *)min_local;
    }
    if (!bVar1) break;
    st2_local = st2_local + 1;
    min_local = min_local + 1;
  }
  if ((*st2_local == '\0') ||
     ((local_2a = false, 0 < min && (local_2a = false, min <= (long)st2_local - (long)st1)))) {
    local_2b = true;
    if (*(char *)min_local != '\0') {
      local_2b = *(char *)min_local == '=';
    }
    local_2a = local_2b;
  }
  return local_2a;
}

Assistant:

static bool streqabbr(const char* st1, const char* st2, long long min)
  {
    const char* st1start = st1;
    while (*st1 != 0 && (*st1 == *st2))
    {
      ++st1;
      ++st2;
    }

    return (*st1 == 0 || (min > 0 && (st1 - st1start) >= min)) && (*st2 == 0 || *st2 == '=');
  }